

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesRasClearStateExp(zes_ras_handle_t hRas,zes_ras_error_category_exp_t category)

{
  zes_pfnRasClearStateExp_t pfnClearStateExp;
  ze_result_t result;
  zes_ras_error_category_exp_t category_local;
  zes_ras_handle_t hRas_local;
  
  pfnClearStateExp._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cdf8 != (code *)0x0) {
    pfnClearStateExp._0_4_ = (*DAT_0011cdf8)(hRas,category);
  }
  return (ze_result_t)pfnClearStateExp;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasClearStateExp(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_error_category_exp_t category           ///< [in] category for which error counter is to be cleared.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnClearStateExp = context.zesDdiTable.RasExp.pfnClearStateExp;
        if( nullptr != pfnClearStateExp )
        {
            result = pfnClearStateExp( hRas, category );
        }
        else
        {
            // generic implementation
        }

        return result;
    }